

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall Analyser::analyse_function_call(Analyser *this)

{
  int iVar1;
  string *psVar2;
  pointer pcVar3;
  _Storage<Token,_false> local_130;
  optional<Token> next;
  vector<char,_std::allocator<char>_> para;
  string func;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  nextToken(&next,this);
  if ((next.super__Optional_base<Token,_false,_false>._M_payload.
       super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
       _M_engaged != true) ||
     (next.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type != IDENTIFIER)) {
    psVar2 = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              (local_48,"Missing identifier",(allocator<char> *)&local_130._M_value);
    iVar1 = this->_currentLine;
    std::__cxx11::string::string(psVar2,local_48);
    *(long *)(psVar2 + 0x20) = (long)iVar1;
    __cxa_throw(psVar2,&Error::typeinfo,Error::~Error);
  }
  std::any::any((any *)&local_130._M_value,
                &next.super__Optional_base<Token,_false,_false>._M_payload.
                 super__Optional_payload<Token,_true,_false,_false>.
                 super__Optional_payload_base<Token>._M_payload._M_value._value);
  std::any_cast<std::__cxx11::string>(&func,(any *)&local_130._M_value);
  std::any::reset((any *)&local_130._M_value);
  iVar1 = getFunctionIndex(this,&func);
  getFunctionParameter(&para,this,&func);
  nextToken((optional<Token> *)&local_130._M_value,this);
  std::_Optional_payload_base<Token>::_M_move_assign
            ((_Optional_payload_base<Token> *)&next,
             (_Optional_payload_base<Token> *)&local_130._M_value);
  std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&local_130._M_value)
  ;
  if ((next.super__Optional_base<Token,_false,_false>._M_payload.
       super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
       _M_engaged == true) &&
     (next.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type == LEFT_BRACKET)) {
    pcVar3 = (pointer)0x0;
    do {
      if (para.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish +
          -(long)para.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start <= pcVar3) {
        nextToken((optional<Token> *)&local_130._M_value,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)&next,
                   (_Optional_payload_base<Token> *)&local_130._M_value);
        std::_Optional_payload_base<Token>::_M_reset
                  ((_Optional_payload_base<Token> *)&local_130._M_value);
        if ((next.super__Optional_base<Token,_false,_false>._M_payload.
             super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
             _M_engaged == true) &&
           (next.super__Optional_base<Token,_false,_false>._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_payload._M_value._type == RIGHT_BRACKET)) {
          local_130._M_value._type = DIVISION_SIGN;
          local_130._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x100000000;
          local_130._4_4_ = iVar1;
          addInstruction(this,(Instruction *)&local_130._M_value);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&para.super__Vector_base<char,_std::allocator<char>_>);
          std::__cxx11::string::~string((string *)&func);
          std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&next);
          return;
        }
        psVar2 = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_a8,"Missing \')\'",(allocator<char> *)&local_130._M_value);
        iVar1 = this->_currentLine;
        std::__cxx11::string::string(psVar2,local_a8);
        *(long *)(psVar2 + 0x20) = (long)iVar1;
        __cxa_throw(psVar2,&Error::typeinfo,Error::~Error);
      }
      analyse_expression(this);
      if (pcVar3 != para.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish +
                    ~(ulong)para.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start) {
        nextToken((optional<Token> *)&local_130._M_value,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)&next,
                   (_Optional_payload_base<Token> *)&local_130._M_value);
        std::_Optional_payload_base<Token>::_M_reset
                  ((_Optional_payload_base<Token> *)&local_130._M_value);
        if ((next.super__Optional_base<Token,_false,_false>._M_payload.
             super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
             _M_engaged != true) ||
           (next.super__Optional_base<Token,_false,_false>._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_payload._M_value._type != COMMA_SIGH)) {
          psVar2 = (string *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_88,"Missing \',\'",(allocator<char> *)&local_130._M_value);
          iVar1 = this->_currentLine;
          std::__cxx11::string::string(psVar2,local_88);
          *(long *)(psVar2 + 0x20) = (long)iVar1;
          __cxa_throw(psVar2,&Error::typeinfo,Error::~Error);
        }
      }
      pcVar3 = pcVar3 + 1;
    } while( true );
  }
  psVar2 = (string *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"Missing \'(\'",(allocator<char> *)&local_130._M_value);
  iVar1 = this->_currentLine;
  std::__cxx11::string::string(psVar2,local_68);
  *(long *)(psVar2 + 0x20) = (long)iVar1;
  __cxa_throw(psVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

void Analyser::analyse_function_call() {
	//<identifier>
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::IDENTIFIER) {
		throw Error("Missing identifier", _currentLine);
	}
	std::string func = std::any_cast<std::string>(next.value().GetValue());
	int index = getFunctionIndex(func);
	std::vector<char> para = getFunctionParameter(func);
	//'('
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::LEFT_BRACKET) {
		throw Error("Missing '('", _currentLine);
	}
	//<expression-list>
	for (int i = 0; i < para.size(); i++) {
		analyse_expression();
		if (i != para.size() - 1) {
			next = nextToken();
			if (!next.has_value() || next.value().GetType() != TokenType::COMMA_SIGH) {
				throw Error("Missing ','", _currentLine);
			}
		}
	}
	//')'
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
		throw Error("Missing ')'", _currentLine);
	}
	addInstruction(Instruction(Operation::call, index));
}